

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

uint64_t __thiscall fmp4_stream::tfhd::size(tfhd *this)

{
  uint64_t uVar1;
  uint64_t local_18;
  uint64_t l_size;
  tfhd *this_local;
  
  uVar1 = full_box::size(&this->super_full_box);
  local_18 = uVar1 + 4;
  if (((this->super_full_box).field_0x6c & 1) != 0) {
    local_18 = uVar1 + 0xc;
  }
  if (this->sample_description_index_ != 0) {
    local_18 = local_18 + 4;
  }
  if (((this->super_full_box).field_0x6e & 1) != 0) {
    local_18 = local_18 + 4;
  }
  if (((this->super_full_box).field_0x6f & 1) != 0) {
    local_18 = local_18 + 4;
  }
  if ((this->default_sample_flags_present_ & 1U) != 0) {
    local_18 = local_18 + 4;
  }
  return local_18;
}

Assistant:

uint64_t tfhd::size() const
	{
		uint64_t l_size = full_box::size() + 4;
		if (base_data_offset_present_)
			l_size += 8;
		if (sample_description_index_)
			l_size += 4;
		if (default_sample_duration_present_)
			l_size += 4;
		if (default_sample_size_present_)
			l_size += 4;
		if (default_sample_flags_present_)
			l_size += 4;

		return l_size;
	}